

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ArgSortLayerParams::ArgSortLayerParams
          (ArgSortLayerParams *this,ArgSortLayerParams *from)

{
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ArgSortLayerParams_00401f78;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  this->descending_ = from->descending_;
  this->axis_ = from->axis_;
  return;
}

Assistant:

ArgSortLayerParams::ArgSortLayerParams(const ArgSortLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&axis_, &from.axis_,
    static_cast<size_t>(reinterpret_cast<char*>(&descending_) -
    reinterpret_cast<char*>(&axis_)) + sizeof(descending_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ArgSortLayerParams)
}